

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SimdLdArrGeneric<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  byte dataWidth_00;
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  long lVar7;
  SIMDValue bValue;
  ArrayBufferBase *local_80;
  AsmJsSIMDValue value;
  AsmJsSIMDValue *data;
  RegSlot dstReg;
  uint8 dataWidth;
  BYTE *buffer;
  ArrayBufferBase *arr;
  uint64 index;
  OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2029,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iVar4 = GetRegRawInt<unsigned_int>(this,playout->SlotIndex);
  if (iVar4 < 0) {
    JavascriptError::ThrowRangeError
              (*(ScriptContext **)(this + 0x78),-0x7ff5ebf6,L"Simd typed array access");
  }
  iVar4 = GetRegRawInt<unsigned_int>(this,playout->SlotIndex);
  lVar7 = (long)iVar4 + (ulong)playout->Offset;
  bVar3 = ParseableFunctionInfo::IsWasmFunction(*(ParseableFunctionInfo **)(this + 0x88));
  if (bVar3) {
    local_80 = WebAssemblyMemory::GetBuffer(*(WebAssemblyMemory **)(this + 0x138));
  }
  else {
    local_80 = (ArrayBufferBase *)GetAsmJsBuffer(this);
  }
  iVar4 = (*(local_80->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
  dataWidth_00 = playout->DataWidth;
  uVar1 = playout->Value;
  uVar5 = (*(local_80->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar5 < lVar7 + (ulong)dataWidth_00) {
    JavascriptError::ThrowRangeError
              (*(ScriptContext **)(this + 0x78),-0x7ff5ebf6,L"Simd typed array access");
  }
  bValue = SIMDUtils::SIMDLdData((SIMDValue *)(CONCAT44(extraout_var,iVar4) + lVar7),dataWidth_00);
  SetRegRawSimd<unsigned_int>(this,(uint)uVar1,(AsmJsSIMDValue)bValue.field_0);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdLdArrGeneric(const unaligned T* playout)
    {
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);

        if (GetRegRawInt(playout->SlotIndex) < 0) {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }

        const uint64 index = (uint64)GetRegRawInt(playout->SlotIndex) + playout->Offset;

        ArrayBufferBase* arr =
#ifdef ENABLE_WASM_SIMD
        (m_functionBody->IsWasmFunction()) ?
            m_wasmMemory->GetBuffer() :
#endif
            GetAsmJsBuffer();

        BYTE* buffer = arr->GetBuffer();
        uint8 dataWidth = playout->DataWidth;
        RegSlot dstReg = playout->Value;
        if (index + dataWidth > arr->GetByteLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        AsmJsSIMDValue *data = (AsmJsSIMDValue*)(buffer + index);
        AsmJsSIMDValue value;

        value = SIMDUtils::SIMDLdData(data, dataWidth);
        SetRegRawSimd(dstReg, value);
    }